

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TiledOutputFile::writeTiles
          (TiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  TileMap *this_00;
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  pthread_mutex_t *__mutex;
  Data *pDVar3;
  pointer ppTVar4;
  TileBuffer *pTVar5;
  OutputStreamMutex *streamData;
  char *pixelData;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  TileBufferTask *pTVar12;
  uint64_t *puVar13;
  iterator iVar14;
  iterator iVar15;
  void *pvVar16;
  _Base_ptr p_Var17;
  _Rb_tree_node_base *p_Var18;
  _Base_ptr p_Var19;
  ostream *poVar20;
  ArgExc *pAVar21;
  IoExc *this_01;
  int iVar22;
  int iVar23;
  _Base_ptr p_Var24;
  uint uVar25;
  long lVar26;
  TileCoord *__y;
  TileCoord *extraout_RDX;
  TileCoord *__y_00;
  TileCoord *extraout_RDX_00;
  TileCoord *extraout_RDX_01;
  TileCoord *extraout_RDX_02;
  TileCoord *pTVar27;
  TileCoord *extraout_RDX_03;
  TileCoord *extraout_RDX_04;
  ulong uVar28;
  ulong uVar29;
  string *psVar30;
  string *psVar31;
  _Base_ptr p_Var32;
  int iVar33;
  int iVar34;
  _Rb_tree_node_base *__x;
  _Rb_tree_node_base *p_Var35;
  TileCoord TVar36;
  undefined1 auVar37 [16];
  int local_3ac;
  TileCoord currentTile;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  TaskGroup taskGroup;
  
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar7 = pthread_mutex_lock(__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pDVar3 = this->_data;
  if ((pDVar3->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar3->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar21,"No frame buffer specified as pixel data source.");
  }
  else {
    bVar6 = isValidTile(this,dx1,dy1,lx,ly);
    if ((bVar6) && (bVar6 = isValidTile(this,dx2,dy2,lx,ly), bVar6)) {
      if (((ly | lx) < 0) ||
         ((((lx != ly && ((pDVar3->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar3->numXLevels <= lx))
          || (pDVar3->numYLevels <= ly)))) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        std::__ostream_insert<char,std::char_traits<char>>(local_330,"Level coordinate (",0x12);
        poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,lx);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
        poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,ly);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,") is invalid.",0xd);
        pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar21,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar21,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      iVar7 = dx2;
      if (dx2 < dx1) {
        iVar7 = dx1;
      }
      lVar10 = (long)dx2;
      if (dx1 < dx2) {
        dx2 = dx1;
      }
      iVar22 = dy2;
      if (dy2 < dy1) {
        iVar22 = dy1;
      }
      lVar26 = (long)dy2;
      if (dy1 < dy2) {
        dy2 = dy1;
      }
      bVar6 = pDVar3->lineOrder != DECREASING_Y;
      if (!bVar6) {
        dy2 = iVar22;
      }
      lVar10 = dx1 - lVar10;
      lVar11 = -lVar10;
      if (0 < lVar10) {
        lVar11 = lVar10;
      }
      lVar26 = dy1 - lVar26;
      lVar10 = -lVar26;
      if (0 < lVar26) {
        lVar10 = lVar26;
      }
      uVar25 = ((int)lVar10 + 1) * ((int)lVar11 + 1);
      uVar28 = (ulong)((long)(pDVar3->tileBuffers).
                             super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pDVar3->tileBuffers).
                            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3;
      uVar29 = uVar28 & 0xffffffff;
      if ((int)uVar25 < (int)uVar28) {
        uVar29 = (ulong)uVar25;
      }
      IlmThread_3_4::TaskGroup::TaskGroup(&taskGroup);
      iVar8 = (uint)bVar6 * 2 + -1;
      iVar22 = dx2;
      local_3ac = dy2;
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      else {
        iVar33 = 0;
        do {
          pTVar12 = (TileBufferTask *)operator_new(0x20);
          anon_unknown_6::TileBufferTask::TileBufferTask
                    (pTVar12,&taskGroup,this->_data,iVar33,iVar22,local_3ac,lx,ly);
          IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar12);
          iVar33 = iVar33 + 1;
          iVar34 = iVar22 + 1;
          bVar6 = iVar22 < iVar7;
          iVar9 = iVar8;
          iVar22 = dx2;
          if (bVar6) {
            iVar9 = 0;
            iVar22 = iVar34;
          }
          local_3ac = local_3ac + iVar9;
        } while ((int)uVar29 != iVar33);
      }
      if (0 < (int)uVar25) {
        uVar28 = 0;
        iVar33 = dx2;
        do {
          ppTVar4 = (this->_data->tileBuffers).
                    super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pTVar5 = ppTVar4[uVar28 % (ulong)((long)(this->_data->tileBuffers).
                                                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppTVar4 >> 3)];
          IlmThread_3_4::Semaphore::wait();
          pDVar3 = this->_data;
          streamData = this->_streamData;
          pixelData = pTVar5->dataPtr;
          iVar34 = (int)pTVar5->dataSize;
          puVar13 = TileOffsets::operator()(&pDVar3->tileOffsets,iVar33,dy2,lx,ly);
          if (*puVar13 != 0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_330,"Attempt to write tile (",0x17);
            poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar33);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
            poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,dy2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
            poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,lx);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
            poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,ly);
            std::__ostream_insert<char,std::char_traits<char>>(poVar20,") more than once.",0x11);
            pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(pAVar21,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar21,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
          }
          if (pDVar3->lineOrder == RANDOM_Y) {
            anon_unknown_6::writeTileData(streamData,pDVar3,iVar33,dy2,lx,ly,pixelData,iVar34);
          }
          else {
            currentTile.ly = ly;
            this_00 = &pDVar3->tileMap;
            currentTile.dx = iVar33;
            currentTile.dy = dy2;
            currentTile.lx = lx;
            iVar14 = std::
                     map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                     ::find(this_00,&currentTile);
            p_Var1 = &(pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)iVar14._M_node != p_Var1) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_330,"Attempt to write tile (",0x17);
              poVar20 = (ostream *)std::ostream::operator<<((ostream *)local_330,iVar33);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
              poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,dy2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
              poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,lx);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
              poVar20 = (ostream *)std::ostream::operator<<((ostream *)poVar20,ly);
              std::__ostream_insert<char,std::char_traits<char>>(poVar20,") more than once.",0x11);
              pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar21,(stringstream *)&_iex_throw_s);
              __cxa_throw(pAVar21,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            if ((((pDVar3->nextTileToWrite).lx == lx) && ((pDVar3->nextTileToWrite).ly == ly)) &&
               ((pTVar27 = &pDVar3->nextTileToWrite, pTVar27->dx == iVar33 &&
                ((pDVar3->nextTileToWrite).dy == dy2)))) {
              anon_unknown_6::writeTileData(streamData,pDVar3,iVar33,dy2,lx,ly,pixelData,iVar34);
              TVar36 = Data::nextTileCoord(pDVar3,*(TileCoord **)&pDVar3->nextTileToWrite);
              pDVar3->nextTileToWrite = TVar36;
              iVar15 = std::
                       map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                       ::find(this_00,pTVar27);
              while (iVar15._M_node != iVar14._M_node) {
                anon_unknown_6::writeTileData
                          (streamData,pDVar3,iVar15._M_node[1]._M_color,
                           *(int *)&iVar15._M_node[1].field_0x4,*(int *)&iVar15._M_node[1]._M_parent
                           ,*(int *)((long)&iVar15._M_node[1]._M_parent + 4),
                           *(char **)iVar15._M_node[1]._M_left,
                           *(int *)&(iVar15._M_node[1]._M_left)->_M_parent);
                p_Var19 = iVar15._M_node[1]._M_left;
                if ((p_Var19 != (_Base_ptr)0x0) && (*(void **)p_Var19 != (void *)0x0)) {
                  operator_delete__(*(void **)p_Var19);
                }
                operator_delete(p_Var19,0x10);
                pvVar16 = (void *)std::_Rb_tree_rebalance_for_erase
                                            (iVar15._M_node,&p_Var1->_M_header);
                operator_delete(pvVar16,0x38);
                psVar2 = &(pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar2 = *psVar2 - 1;
                TVar36 = Data::nextTileCoord(pDVar3,*(TileCoord **)&pDVar3->nextTileToWrite);
                pDVar3->nextTileToWrite = TVar36;
                iVar15 = std::
                         map<Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_3_4::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_3_4::(anonymous_namespace)::TileCoord,_Imf_3_4::(anonymous_namespace)::BufferedTile_*>_>_>
                         ::find(this_00,pTVar27);
              }
            }
            else {
              p_Var17 = (_Base_ptr)operator_new(0x10);
              *(undefined8 *)p_Var17 = 0;
              *(int *)&p_Var17->_M_parent = iVar34;
              pvVar16 = operator_new__((long)iVar34);
              *(void **)p_Var17 = pvVar16;
              memcpy(pvVar16,pixelData,(long)iVar34);
              p_Var19 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              bVar6 = true;
              p_Var24 = &p_Var1->_M_header;
              p_Var32 = &p_Var1->_M_header;
              if (p_Var19 == (_Base_ptr)0x0) {
LAB_001a8af2:
                p_Var18 = (_Rb_tree_node_base *)operator_new(0x38);
                __x = p_Var18 + 1;
                *(ulong *)(p_Var18 + 1) = CONCAT44(currentTile.dy,currentTile.dx);
                p_Var18[1]._M_parent = (_Base_ptr)CONCAT44(currentTile.ly,currentTile.lx);
                p_Var18[1]._M_left = (_Base_ptr)0x0;
                if (bVar6) {
                  pTVar27 = __y;
                  if ((pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                    p_Var19 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_right;
                    bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                       (p_Var19 + 1),(TileCoord *)__x,__y);
                    pTVar27 = extraout_RDX;
                    if (bVar6) {
                      p_Var24 = (_Base_ptr)0x0;
                      goto LAB_001a8ca4;
                    }
                  }
LAB_001a8c01:
                  p_Var19 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  ;
                  p_Var35 = &p_Var1->_M_header;
                  if (p_Var19 == (_Base_ptr)0x0) {
LAB_001a8c3a:
                    if (p_Var35 ==
                        (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
                    goto LAB_001a8c63;
                    auVar37 = std::_Rb_tree_decrement(p_Var35);
                  }
                  else {
                    do {
                      p_Var35 = p_Var19;
                      bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                        ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                         (TileCoord *)(p_Var35 + 1),pTVar27);
                      auVar37._8_8_ = extraout_RDX_03;
                      auVar37._0_8_ = p_Var35;
                      p_Var19 = (&p_Var35->_M_left)[!bVar6];
                      pTVar27 = extraout_RDX_03;
                    } while ((&p_Var35->_M_left)[!bVar6] != (_Base_ptr)0x0);
                    if (bVar6) goto LAB_001a8c3a;
                  }
                  p_Var32 = auVar37._0_8_;
                  bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                     (p_Var32 + 1),(TileCoord *)__x,auVar37._8_8_);
                  pTVar27 = extraout_RDX_04;
                  if (!bVar6) {
LAB_001a8cea:
                    operator_delete(p_Var18,0x38);
                    goto LAB_001a8d03;
                  }
LAB_001a8c63:
                  p_Var24 = (_Base_ptr)0x0;
                }
                else {
                  bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                     (TileCoord *)(p_Var32 + 1),__y);
                  if (bVar6) {
                    p_Var19 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                    ;
                    p_Var24 = p_Var19;
                    pTVar27 = __y_00;
                    if (p_Var19 == p_Var32) goto LAB_001a8ca4;
                    auVar37 = std::_Rb_tree_decrement(p_Var32);
                    p_Var35 = auVar37._0_8_;
                    bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                       (p_Var35 + 1),(TileCoord *)__x,auVar37._8_8_);
                    pTVar27 = extraout_RDX_00;
                    if (!bVar6) goto LAB_001a8c01;
                    p_Var19 = p_Var32;
                    p_Var24 = p_Var32;
                    if (p_Var35->_M_right != (_Base_ptr)0x0) goto LAB_001a8ca4;
                    goto LAB_001a8c63;
                  }
                  bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)
                                     (p_Var32 + 1),(TileCoord *)__x,__y_00);
                  if (!bVar6) goto LAB_001a8cea;
                  p_Var19 = (pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  if (p_Var19 == p_Var32) {
                    p_Var24 = (_Base_ptr)0x0;
                    pTVar27 = extraout_RDX_01;
                  }
                  else {
                    auVar37 = std::_Rb_tree_increment(p_Var32);
                    p_Var19 = auVar37._0_8_;
                    bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                      ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                       (TileCoord *)(p_Var19 + 1),auVar37._8_8_);
                    pTVar27 = extraout_RDX_02;
                    if (!bVar6) goto LAB_001a8c01;
                    p_Var24 = p_Var19;
                    p_Var35 = p_Var32;
                    if (p_Var32->_M_right == (_Base_ptr)0x0) goto LAB_001a8c63;
                  }
LAB_001a8ca4:
                  p_Var32 = p_Var24;
                  p_Var35 = p_Var19;
                  if (p_Var19 == (_Base_ptr)0x0) goto LAB_001a8cea;
                }
                bVar6 = true;
                if ((p_Var24 == (_Base_ptr)0x0) && (iVar14._M_node != p_Var35)) {
                  bVar6 = std::less<Imf_3_4::(anonymous_namespace)::TileCoord>::operator()
                                    ((less<Imf_3_4::(anonymous_namespace)::TileCoord> *)__x,
                                     (TileCoord *)(p_Var35 + 1),pTVar27);
                }
                std::_Rb_tree_insert_and_rebalance(bVar6,p_Var18,p_Var35,&p_Var1->_M_header);
                psVar2 = &(pDVar3->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                *psVar2 = *psVar2 + 1;
                p_Var32 = p_Var18;
              }
              else {
                do {
                  iVar34 = *(int *)((long)&p_Var19[1]._M_parent + 4);
                  if (iVar34 < ly) {
LAB_001a8a84:
                    lVar10 = 0x18;
                    p_Var32 = p_Var24;
                  }
                  else {
                    lVar10 = 0x10;
                    p_Var32 = p_Var19;
                    if (iVar34 == ly) {
                      if (*(int *)&p_Var19[1]._M_parent < lx) goto LAB_001a8a84;
                      if (*(int *)&p_Var19[1]._M_parent == lx) {
                        if (*(int *)&p_Var19[1].field_0x4 < dy2) goto LAB_001a8a84;
                        if (*(int *)&p_Var19[1].field_0x4 == dy2) {
                          if (iVar33 <= (int)p_Var19[1]._M_color) {
                            p_Var24 = p_Var19;
                          }
                          lVar10 = (ulong)((int)p_Var19[1]._M_color < iVar33) * 8 + 0x10;
                          p_Var32 = p_Var24;
                        }
                      }
                    }
                  }
                  p_Var19 = *(_Base_ptr *)
                             ((long)&((_Rb_tree_node_base *)&p_Var19->_M_color)->_M_color + lVar10);
                  p_Var24 = p_Var32;
                } while (p_Var19 != (_Base_ptr)0x0);
                if (p_Var32 == iVar14._M_node) goto LAB_001a8af2;
                iVar34 = *(int *)((long)&p_Var32[1]._M_parent + 4);
                if ((ly < iVar34) ||
                   ((iVar34 == ly &&
                    ((lx < *(int *)&p_Var32[1]._M_parent ||
                     ((*(int *)&p_Var32[1]._M_parent == lx &&
                      ((dy2 < *(int *)&p_Var32[1].field_0x4 ||
                       ((*(int *)&p_Var32[1].field_0x4 == dy2 && (iVar33 < (int)p_Var32[1]._M_color)
                        ))))))))))) {
                  bVar6 = false;
                  goto LAB_001a8af2;
                }
              }
LAB_001a8d03:
              p_Var32[1]._M_left = p_Var17;
            }
          }
          IlmThread_3_4::Semaphore::post();
          iVar34 = (int)uVar29;
          if (iVar34 < (int)uVar25) {
            pTVar12 = (TileBufferTask *)operator_new(0x20);
            anon_unknown_6::TileBufferTask::TileBufferTask
                      (pTVar12,&taskGroup,this->_data,iVar34,iVar22,local_3ac,lx,ly);
            IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pTVar12);
          }
          uVar28 = uVar28 + 1;
          iVar9 = iVar33 + 1;
          if (iVar7 <= iVar33) {
            iVar9 = dx2;
          }
          iVar23 = iVar8;
          if (iVar33 < iVar7) {
            iVar23 = 0;
          }
          dy2 = dy2 + iVar23;
          uVar29 = (ulong)(iVar34 + 1);
          iVar33 = iVar22 + 1;
          bVar6 = iVar22 < iVar7;
          iVar34 = iVar8;
          iVar22 = dx2;
          if (bVar6) {
            iVar34 = 0;
            iVar22 = iVar33;
          }
          local_3ac = local_3ac + iVar34;
          iVar33 = iVar9;
        } while (uVar28 != uVar25);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar4 = (this->_data->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(this->_data->tileBuffers).
                     super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4;
      if (lVar10 != 0) {
        lVar10 = lVar10 >> 3;
        lVar26 = 0;
        psVar30 = (string *)0x0;
        do {
          pTVar5 = ppTVar4[lVar26];
          psVar31 = (string *)&pTVar5->sampleCountTablePtr;
          if (psVar30 != (string *)0x0) {
            psVar31 = psVar30;
          }
          if (*(char *)&(pTVar5->sampleCountTableBuffer)._data == '\0') {
            psVar31 = psVar30;
          }
          *(undefined1 *)&(pTVar5->sampleCountTableBuffer)._data = 0;
          lVar26 = lVar26 + 1;
          psVar30 = psVar31;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar26);
        if (psVar31 != (string *)0x0) {
          this_01 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::IoExc::IoExc(this_01,psVar31);
          __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
        }
      }
      pthread_mutex_unlock(__mutex);
      return;
    }
    pAVar21 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar21,"Tile coordinates are invalid.");
  }
  __cxa_throw(pAVar21,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2) swap (dx1, dx2);

        if (dy1 > dy2) swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int) _data->tileBuffers.size (), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (
                    &taskGroup,
                    _data,
                    nextCompBuffer++,
                    dxComp,
                    dyComp,
                    lx,
                    ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite (
                    _streamData,
                    _data,
                    dxWrite,
                    dyWrite,
                    lx,
                    ly,
                    writeBuffer->dataPtr,
                    writeBuffer->dataSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post ();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask (new TileBufferTask (
                        &taskGroup,
                        _data,
                        nextCompBuffer,
                        dxComp,
                        dyComp,
                        lx,
                        ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}